

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O3

result_type __thiscall
Well<unsigned_int,_32UL,_17UL,_23UL,_13UL,_11UL,_10UL,_Detail::M3<-13>,_Detail::M3<-15>,_Detail::M1,_Detail::M2<-21>,_Detail::M3<-13>,_Detail::M2<1>,_Detail::M0,_Detail::M3<11>,_Detail::NoTempering>
::operator()(Well<unsigned_int,_32UL,_17UL,_23UL,_13UL,_11UL,_10UL,_Detail::M3<_13>,_Detail::M3<_15>,_Detail::M1,_Detail::M2<_21>,_Detail::M3<_13>,_Detail::M2<1>,_Detail::M0,_Detail::M3<11>,_Detail::NoTempering>
             *this)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  sVar3 = this->index_;
  uVar1 = sVar3 + 0x10;
  if (uVar1 < 0x22) {
    uVar7 = sVar3 - 1;
    if (uVar1 < 0x11) {
      uVar7 = uVar1;
    }
    uVar1 = sVar3 + 0xf;
    if (uVar1 < 0x22) {
      uVar6 = sVar3 - 2;
      if (uVar1 < 0x11) {
        uVar6 = uVar1;
      }
      uVar1 = sVar3 + 0xd;
      if (uVar1 < 0x22) {
        uVar10 = sVar3 + 0xb;
        uVar9 = sVar3 - 4;
        if (uVar1 < 0x11) {
          uVar9 = uVar1;
        }
        if ((uVar10 < 0x22) && (uVar1 = sVar3 + 10, uVar1 < 0x22)) {
          uVar5 = this->state_[uVar7];
          uVar2 = this->state_[uVar6];
          uVar6 = sVar3 - 6;
          if (uVar10 < 0x11) {
            uVar6 = uVar10;
          }
          uVar4 = this->state_[uVar9] << 0xf ^
                  this->state_[sVar3] << 0xd ^ this->state_[sVar3] ^ this->state_[uVar9];
          uVar10 = sVar3 - 7;
          if (uVar1 < 0x11) {
            uVar10 = uVar1;
          }
          uVar8 = this->state_[uVar10] << 0x15 ^ this->state_[uVar6] ^ uVar4;
          this->state_[sVar3] = uVar8;
          uVar5 = uVar4 >> 1 ^ uVar2 << 0xd ^ (uVar2 & 0x7fffff | uVar5 & 0xff800000) ^ uVar8 ^
                  uVar8 >> 0xb;
          this->state_[uVar7] = uVar5;
          this->index_ = uVar7;
          return uVar5;
        }
      }
    }
  }
  __assert_fail("value < 2 * r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sehe[P]well-random/well.hpp"
                ,0x9e,
                "static T Detail::Modulo<unsigned long, 17>::calc(T, std::false_type) [UIntType = unsigned long, r = 17, T = unsigned long]"
               );
}

Assistant:

result_type operator()()
    {
        const UIntType upper_mask = ~0U << p;
        const UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        std::size_t i = index_;
        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        std::size_t j = i + r;
        std::size_t k = mod(j - 1); // [i,r-1]
        std::size_t l = mod(j - 2); // [i,r-2]

        std::size_t im1 = i + m1;
        std::size_t im2 = i + m2;
        std::size_t im3 = i + m3;

        UIntType z0, z1, z2, z3, z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state(im1));
        z2 = T2::transform(state(im2)) ^
             T3::transform(state(im3));
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<r>(z4, state_, im2);
    }